

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqliteOpenJournal(Pager *pPager)

{
  int iVar1;
  uchar *zBuf;
  int local_24;
  int rc;
  uchar *zHeader;
  Pager *pPager_local;
  
  local_24 = 0;
  if ((pPager->is_mem == 0) && (pPager->no_jrnl == 0)) {
    if (2 < pPager->iState) {
      return 0;
    }
    unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
    iVar1 = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,&pPager->pjfd,6);
    if (iVar1 != 0) {
      unqliteGenErrorFormat(pPager->pDb,"IO error while opening journal file: %s",pPager->zJournal);
      return iVar1;
    }
    zBuf = (uchar *)SyMemBackendAlloc(pPager->pAllocator,pPager->iSectorSize);
    if (zBuf == (uchar *)0x0) {
      local_24 = -1;
      goto LAB_0011fb10;
    }
    pager_write_journal_header(pPager,zBuf);
    local_24 = unqliteOsWrite(pPager->pjfd,zBuf,(long)pPager->iSectorSize,0);
    pPager->iJournalOfft = (long)pPager->iSectorSize;
    SyMemBackendFree(pPager->pAllocator,zBuf);
  }
  if (local_24 == 0) {
    pPager->iState = 3;
    return 0;
  }
LAB_0011fb10:
  unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
  unqliteOsDelete(pPager->pVfs,pPager->zJournal,0);
  pPager->pjfd = (unqlite_file *)0x0;
  return local_24;
}

Assistant:

static int unqliteOpenJournal(Pager *pPager)
{
	unsigned char *zHeader;
	int rc = UNQLITE_OK;
	if( pPager->is_mem || pPager->no_jrnl ){
		/* Journaling is omitted for this database */
		goto finish;
	}
	if( pPager->iState >= PAGER_WRITER_CACHEMOD ){
		/* Already opened */
		return UNQLITE_OK;
	}
	/* Delete any previously journal with the same name */
	unqliteOsDelete(pPager->pVfs,pPager->zJournal,1);
	/* Open the journal file */
	rc = unqliteOsOpen(pPager->pVfs,pPager->pAllocator,pPager->zJournal,
		&pPager->pjfd,UNQLITE_OPEN_CREATE|UNQLITE_OPEN_READWRITE);
	if( rc != UNQLITE_OK ){
		unqliteGenErrorFormat(pPager->pDb,"IO error while opening journal file: %s",pPager->zJournal);
		return rc;
	}
	/* Write the journal header */
	zHeader = (unsigned char *)SyMemBackendAlloc(pPager->pAllocator,(sxu32)pPager->iSectorSize);
	if( zHeader == 0 ){
		rc = UNQLITE_NOMEM;
		goto fail;
	}
	pager_write_journal_header(pPager,zHeader);
	/* Perform the disk write */
	rc = unqliteOsWrite(pPager->pjfd,zHeader,pPager->iSectorSize,0);
	/* Offset to start writing from */
	pPager->iJournalOfft = pPager->iSectorSize;
	/* All done, journal will be synced later */
	SyMemBackendFree(pPager->pAllocator,zHeader);
finish:
	if( rc == UNQLITE_OK ){
		pPager->iState = PAGER_WRITER_CACHEMOD;
		return UNQLITE_OK;
	}
fail:
	/* Unlink the journal file if something goes wrong */
	unqliteOsCloseFree(pPager->pAllocator,pPager->pjfd);
	unqliteOsDelete(pPager->pVfs,pPager->zJournal,0);
	pPager->pjfd = 0;
	return rc;
}